

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_describe_scaling_configurations.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3f9ce::
Json2Array<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType>::Json2Array
          (Json2Array<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType> *this,
          Value *value,
          vector<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType,_std::allocator<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_188 [8];
  EssDescribeScalingConfigurationsScalingConfigurationType val;
  int i;
  vector<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType,_std::allocator<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.creation_time.field_2._12_4_ = 0; uVar1 = val.creation_time.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.creation_time.field_2._12_4_ = val.creation_time.field_2._12_4_ + 1) {
      aliyun::EssDescribeScalingConfigurationsScalingConfigurationType::
      EssDescribeScalingConfigurationsScalingConfigurationType
                ((EssDescribeScalingConfigurationsScalingConfigurationType *)local_188);
      value_00 = Json::Value::operator[](value,val.creation_time.field_2._12_4_);
      anon_unknown.dwarf_3f9ce::Json2Type
                (value_00,(EssDescribeScalingConfigurationsScalingConfigurationType *)local_188);
      std::
      vector<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType,_std::allocator<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType>_>
      ::push_back(vec,(value_type *)local_188);
      aliyun::EssDescribeScalingConfigurationsScalingConfigurationType::
      ~EssDescribeScalingConfigurationsScalingConfigurationType
                ((EssDescribeScalingConfigurationsScalingConfigurationType *)local_188);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }